

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O1

int enet_host_service(ENetHost *host,ENetEvent *event,enet_uint32 timeout)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ENetPeerState EVar3;
  uint *puVar4;
  ENetChecksumCallback p_Var5;
  void *pvVar6;
  _func_size_t_void_ptr_enet_uint8_ptr_size_t_enet_uint8_ptr_size_t *p_Var7;
  enet_uint8 (*paeVar8) [4096];
  ENetProtocol *pEVar9;
  ushort uVar10;
  ushort uVar11;
  int iVar12;
  enet_uint32 eVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  ENetProtocolCommand EVar17;
  size_t sVar18;
  ENetProtocol *pEVar19;
  ENetPeer *peer;
  ENetIncomingCommand *pEVar20;
  ENetIncomingCommand *pEVar21;
  uint uVar22;
  enet_uint32 eVar23;
  ulong uVar24;
  ushort uVar26;
  uint uVar27;
  enet_uint16 *peVar28;
  uint uVar29;
  ushort uVar30;
  uint uVar31;
  ushort uVar32;
  size_t sVar33;
  ENetProtocol *command;
  char cVar34;
  int iVar35;
  uint uVar36;
  ENetChannel *pEVar37;
  ENetProtocol *pEVar38;
  bool bVar39;
  enet_uint32 waitCondition;
  ENetIncomingCommand *local_c8;
  enet_uint32 local_bc;
  ulong local_b8;
  ENetEvent *local_b0;
  int local_a4;
  ENetChannel *local_a0;
  uint *local_98;
  enet_uint8 (*local_90) [4096];
  ENetAddress *local_88;
  enet_uint8 (*local_80) [4096];
  ENetBuffer local_78;
  ENetProtocol local_68;
  ulong uVar25;
  
  if (event != (ENetEvent *)0x0) {
    event->type = ENET_EVENT_TYPE_NONE;
    event->peer = (ENetPeer *)0x0;
    event->packet = (ENetPacket *)0x0;
    iVar12 = enet_protocol_dispatch_incoming_commands(host,event);
    if (iVar12 == -1) {
      return -1;
    }
    if (iVar12 == 1) {
      return 1;
    }
  }
  eVar13 = enet_time_get();
  host->serviceTime = eVar13;
  iVar12 = timeout + eVar13;
  local_80 = host->packetData;
  local_88 = &host->receivedAddress;
  local_90 = host->packetData + 1;
  local_b0 = event;
  local_a4 = iVar12;
  do {
    uVar27 = host->serviceTime - host->bandwidthThrottleEpoch;
    uVar15 = host->bandwidthThrottleEpoch - host->serviceTime;
    if (uVar27 < 86400000) {
      uVar15 = uVar27;
    }
    if (999 < uVar15) {
      enet_host_bandwidth_throttle(host);
    }
    iVar14 = enet_protocol_send_outgoing_commands(host,event,1);
    if ((iVar14 == -1) || (iVar14 == 1)) {
      return iVar14;
    }
    iVar35 = 0;
    iVar14 = iVar12;
    do {
      local_78.data = local_80;
      local_78.dataLength = 0x1000;
      uVar15 = enet_socket_receive(host->socket,local_88,&local_78,1);
      bVar39 = true;
      if ((int)uVar15 < 0) {
        iVar16 = -1;
      }
      else if (uVar15 == 0) {
        iVar16 = 0;
      }
      else {
        host->receivedData = *local_80;
        host->receivedDataLength = (ulong)uVar15;
        uVar1 = host->totalReceivedData;
        uVar2 = host->totalReceivedPackets;
        host->totalReceivedData = uVar1 + uVar15;
        host->totalReceivedPackets = uVar2 + 1;
        if (host->intercept == (ENetInterceptCallback)0x0) {
LAB_00105e21:
          bVar39 = true;
          if (3 < host->receivedDataLength) {
            puVar4 = (uint *)host->receivedData;
            uVar15 = *puVar4;
            uVar27 = uVar15 << 0x18;
            uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                     uVar27 & 0xf0ffffff;
            if (uVar15 == 0xffffff) {
              peer = (ENetPeer *)0x0;
LAB_00105e97:
              sVar33 = (ulong)(((uVar27 & 0x8000000) >> 0x1a) +
                              (uint)(host->checksum != (ENetChecksumCallback)0x0) * 4) + 4;
              local_98 = puVar4;
              if ((uVar27 & 0x4000000) == 0) {
LAB_00105eba:
                p_Var5 = host->checksum;
                if (p_Var5 != (ENetChecksumCallback)0x0) {
                  if (peer == (ENetPeer *)0x0) {
                    eVar13 = 0;
                  }
                  else {
                    eVar13 = peer->connectID;
                  }
                  local_68.acknowledge = (ENetProtocolAcknowledge)host->receivedData;
                  eVar23 = *(enet_uint32 *)
                            ((enet_uint8 *)((long)local_68.acknowledge + -4) + sVar33);
                  *(enet_uint32 *)((enet_uint8 *)((long)local_68.acknowledge + -4) + sVar33) =
                       eVar13;
                  local_68._8_8_ = host->receivedDataLength;
                  eVar13 = (*p_Var5)((ENetBuffer *)&local_68.header,1);
                  bVar39 = true;
                  if (eVar13 != eVar23) goto LAB_00105e31;
                }
                if (peer != (ENetPeer *)0x0) {
                  (peer->address).host = (host->receivedAddress).host;
                  (peer->address).port = (host->receivedAddress).port;
                  peer->incomingDataTotal = peer->incomingDataTotal + (int)host->receivedDataLength;
                }
                command = (ENetProtocol *)(host->receivedData + sVar33);
                do {
                  pEVar19 = (ENetProtocol *)(host->receivedData + host->receivedDataLength);
                  if (pEVar19 <= command) goto LAB_00106faf;
                  peVar28 = &(command->acknowledge).receivedReliableSequenceNumber;
                  iVar12 = 3;
                  pEVar9 = command;
                  if (pEVar19 < peVar28) goto switchD_001060fa_default;
                  uVar15 = (command->header).command & 0xf;
                  if (((byte)((char)uVar15 - 0xdU) < 0xf4) ||
                     (pEVar38 = (ENetProtocol *)(commandSizes[uVar15] + (long)command),
                     pEVar19 < pEVar38)) goto switchD_001060fa_default;
                  pEVar9 = pEVar38;
                  if ((peer == (ENetPeer *)0x0) && ((char)uVar15 != '\x02')) {
                    peer = (ENetPeer *)0x0;
                    goto switchD_001060fa_default;
                  }
                  uVar30 = (command->header).reliableSequenceNumber << 8;
                  uVar10 = uVar30 | (command->header).reliableSequenceNumber >> 8;
                  (command->header).reliableSequenceNumber = uVar10;
                  iVar12 = 5;
                  switch(uVar15) {
                  case 1:
                    if ((peer->state != ENET_PEER_STATE_DISCONNECTED) &&
                       (peer->state != ENET_PEER_STATE_ZOMBIE)) {
                      uVar15 = host->serviceTime;
                      uVar36 = (uint)(ushort)((command->acknowledge).receivedSentTime << 8 |
                                             (command->acknowledge).receivedSentTime >> 8);
                      uVar22 = uVar15 & 0xffff0000 | uVar36;
                      uVar31 = uVar22 - 0x10000;
                      if ((uVar36 & 0x8000) <= (uVar15 & 0x8000)) {
                        uVar31 = uVar22;
                      }
                      uVar31 = uVar15 - uVar31;
                      if (uVar31 < 86400000) {
                        peer->lastReceiveTime = uVar15;
                        peer->earliestTimeout = 0;
                        enet_peer_throttle(peer,uVar31);
                        uVar15 = peer->roundTripTime;
                        eVar13 = peer->roundTripTimeVariance - (peer->roundTripTimeVariance >> 2);
                        peer->roundTripTimeVariance = eVar13;
                        if (uVar31 < uVar15) {
                          eVar23 = uVar15 - (uVar15 - uVar31 >> 3);
                          peer->roundTripTime = eVar23;
                          uVar31 = eVar23 - uVar31;
                        }
                        else {
                          eVar23 = (uVar31 - uVar15 >> 3) + uVar15;
                          peer->roundTripTime = eVar23;
                          uVar31 = uVar31 - eVar23;
                        }
                        uVar31 = (uVar31 >> 2) + eVar13;
                        peer->roundTripTimeVariance = uVar31;
                        uVar15 = peer->roundTripTime;
                        if (uVar15 < peer->lowestRoundTripTime) {
                          peer->lowestRoundTripTime = uVar15;
                        }
                        if (peer->highestRoundTripTimeVariance < uVar31) {
                          peer->highestRoundTripTimeVariance = uVar31;
                        }
                        eVar13 = peer->packetThrottleEpoch;
                        if (eVar13 == 0) {
LAB_00106a88:
                          peer->lastRoundTripTime = peer->lowestRoundTripTime;
                          peer->lastRoundTripTimeVariance = peer->highestRoundTripTimeVariance;
                          peer->lowestRoundTripTime = uVar15;
                          peer->highestRoundTripTimeVariance = uVar31;
                          peer->packetThrottleEpoch = host->serviceTime;
                        }
                        else {
                          uVar22 = host->serviceTime - eVar13;
                          uVar36 = eVar13 - host->serviceTime;
                          if (uVar22 < 86400000) {
                            uVar36 = uVar22;
                          }
                          if (peer->packetThrottleInterval <= uVar36) goto LAB_00106a88;
                        }
                        EVar17 = enet_protocol_remove_sent_reliable_command
                                           (peer,(command->acknowledge).
                                                 receivedReliableSequenceNumber << 8 |
                                                 (command->acknowledge).
                                                 receivedReliableSequenceNumber >> 8,
                                            (command->header).channelID);
                        EVar3 = peer->state;
                        if (EVar3 == ENET_PEER_STATE_DISCONNECTING) {
                          if (EVar17 != ENET_PROTOCOL_COMMAND_DISCONNECT) {
LAB_00106a15:
                            iVar12 = 5;
                            break;
                          }
                          enet_protocol_notify_disconnect(host,peer,local_b0);
                        }
                        else if (EVar3 == ENET_PEER_STATE_DISCONNECT_LATER) {
                          if ((((peer->outgoingReliableCommands).sentinel.next ==
                                &(peer->outgoingReliableCommands).sentinel) &&
                              ((peer->outgoingUnreliableCommands).sentinel.next ==
                               &(peer->outgoingUnreliableCommands).sentinel)) &&
                             ((peer->sentReliableCommands).sentinel.next ==
                              &(peer->sentReliableCommands).sentinel)) {
                            enet_peer_disconnect(peer,peer->eventData);
                          }
                        }
                        else if (EVar3 == ENET_PEER_STATE_ACKNOWLEDGING_CONNECT) {
                          if (EVar17 != ENET_PROTOCOL_COMMAND_VERIFY_CONNECT) goto LAB_00106a15;
                          enet_protocol_notify_connect(host,peer,local_b0);
                        }
                      }
                    }
                    goto LAB_001068ae;
                  case 2:
                    if (peer == (ENetPeer *)0x0) {
                      peer = enet_protocol_handle_connect
                                       (host,(ENetProtocolHeader *)&command->header,
                                        (ENetProtocol *)&switchD_001060fa::switchdataD_00109090);
                      if (peer != (ENetPeer *)0x0) goto LAB_001068ae;
                      peer = (ENetPeer *)0x0;
                      goto LAB_00106a15;
                    }
                    break;
                  case 3:
                    if (peer->state == ENET_PEER_STATE_CONNECTING) {
                      uVar15 = (command->connect).channelCount;
                      uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                               uVar15 << 0x18;
                      if ((((uVar15 - 0x100 < 0xffffff01) ||
                           (uVar31 = (command->connect).packetThrottleInterval,
                           (uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8 |
                           uVar31 << 0x18) != peer->packetThrottleInterval)) ||
                          (uVar31 = (command->connect).packetThrottleAcceleration,
                          (uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8 |
                          uVar31 << 0x18) != peer->packetThrottleAcceleration)) ||
                         ((uVar31 = (command->connect).packetThrottleDeceleration,
                          (uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8 |
                          uVar31 << 0x18) != peer->packetThrottleDeceleration ||
                          ((command->connect).connectID != peer->connectID)))) {
                        peer->eventData = 0;
                        enet_protocol_dispatch_state(host,peer,ENET_PEER_STATE_ZOMBIE);
                        iVar12 = 5;
                        break;
                      }
                      enet_protocol_remove_sent_reliable_command(peer,1,0xff);
                      if ((ulong)uVar15 < peer->channelCount) {
                        peer->channelCount = (ulong)uVar15;
                      }
                      uVar15 = (command->connect).outgoingPeerID;
                      peer->outgoingPeerID =
                           uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                           uVar15 << 0x18;
                      peer->incomingSessionID = (command->connect).incomingSessionID;
                      peer->outgoingSessionID = (command->connect).outgoingSessionID;
                      uVar15 = (command->connect).mtu;
                      uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                               uVar15 << 0x18;
                      if (0xfff < uVar15) {
                        uVar15 = 0x1000;
                      }
                      if (uVar15 < 0x241) {
                        uVar15 = 0x240;
                      }
                      if (uVar15 < peer->mtu) {
                        peer->mtu = uVar15;
                      }
                      uVar15 = (command->connect).windowSize;
                      uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                               uVar15 << 0x18;
                      if (uVar15 < 0x1001) {
                        uVar15 = 0x1000;
                      }
                      if (0xffff < uVar15) {
                        uVar15 = 0x10000;
                      }
                      if (uVar15 < peer->windowSize) {
                        peer->windowSize = uVar15;
                      }
                      uVar15 = (command->connect).incomingBandwidth;
                      peer->incomingBandwidth =
                           uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                           uVar15 << 0x18;
                      uVar15 = (command->connect).outgoingBandwidth;
                      peer->outgoingBandwidth =
                           uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                           uVar15 << 0x18;
                      enet_protocol_notify_connect(host,peer,local_b0);
                    }
                    goto LAB_001068ae;
                  case 4:
                    if ((ENET_PEER_STATE_ZOMBIE < peer->state) ||
                       ((0x301U >> (peer->state & 0x1f) & 1) == 0)) {
                      enet_peer_reset_queues(peer);
                      EVar3 = peer->state;
                      if (EVar3 < ENET_PEER_STATE_ACKNOWLEDGING_DISCONNECT) {
                        if ((0x92U >> (EVar3 & 0x1f) & 1) == 0) {
                          if ((0x60U >> (EVar3 & 0x1f) & 1) == 0) {
                            if (EVar3 == ENET_PEER_STATE_CONNECTION_PENDING) {
                              host->recalculateBandwidthLimits = 1;
                            }
                            goto LAB_00106b3a;
                          }
                          if (-1 < (char)(command->header).command) goto LAB_00106558;
                          enet_peer_on_disconnect(peer);
                          peer->state = ENET_PEER_STATE_ACKNOWLEDGING_DISCONNECT;
                        }
                        else {
LAB_00106558:
                          enet_protocol_dispatch_state(host,peer,ENET_PEER_STATE_ZOMBIE);
                        }
                      }
                      else {
LAB_00106b3a:
                        enet_peer_reset(peer);
                      }
                      if (peer->state != ENET_PEER_STATE_DISCONNECTED) {
                        uVar15._0_2_ = *(enet_uint16 *)((long)command + 4);
                        uVar15._2_2_ = *(enet_uint16 *)((long)command + 6);
                        peer->eventData =
                             uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                             uVar15 << 0x18;
                      }
                    }
LAB_001068ae:
                    pEVar9 = pEVar38;
                    if ((peer != (ENetPeer *)0x0) && ((char)(command->header).command < '\0')) {
                      iVar12 = 3;
                      if ((uVar27 >> 0x1b & 1) != 0) {
                        EVar3 = peer->state;
                        iVar12 = 0;
                        if ((ENET_PEER_STATE_ZOMBIE < EVar3) ||
                           (((0x285U >> (EVar3 & 0x1f) & 1) == 0 &&
                            ((EVar3 != ENET_PEER_STATE_ACKNOWLEDGING_DISCONNECT ||
                             (((command->header).command & 0xf) == 4)))))) {
                          enet_peer_queue_acknowledgement
                                    (peer,command,
                                     (ushort)local_98[1] << 8 | (ushort)local_98[1] >> 8);
                          iVar12 = 0;
                        }
                      }
                      if ((uVar27 >> 0x1b & 1) == 0) break;
                    }
                    iVar12 = 0;
                    break;
                  case 5:
                    if (peer->state - ENET_PEER_STATE_CONNECTED < 2) goto LAB_001068ae;
                    break;
                  case 6:
                    if ((peer->channelCount <= (ulong)(command->header).channelID) ||
                       (1 < peer->state - ENET_PEER_STATE_CONNECTED)) goto LAB_00106810;
                    sVar18 = (size_t)(ushort)(*peVar28 << 8 | *peVar28 >> 8);
                    pEVar38 = (ENetProtocol *)((long)pEVar38 + sVar18);
                    if ((host->maximumPacketSize < sVar18) ||
                       ((pEVar38 < (ENetProtocol *)host->receivedData ||
                        ((ENetProtocol *)((long)host->receivedData + host->receivedDataLength) <
                         pEVar38)))) goto LAB_00106810;
                    peVar28 = &(command->acknowledge).receivedSentTime;
                    eVar13 = 1;
LAB_00106bf3:
                    pEVar20 = enet_peer_queue_incoming_command(peer,command,peVar28,sVar18,eVar13,0)
                    ;
                    bVar39 = pEVar20 != (ENetIncomingCommand *)0x0;
                    goto LAB_00106812;
                  case 7:
                    if (((ulong)(command->header).channelID < peer->channelCount) &&
                       (peer->state - ENET_PEER_STATE_CONNECTED < 2)) {
                      sVar18 = (size_t)(ushort)((command->acknowledge).receivedSentTime << 8 |
                                               (command->acknowledge).receivedSentTime >> 8);
                      pEVar38 = (ENetProtocol *)((long)pEVar38 + sVar18);
                      if ((sVar18 <= host->maximumPacketSize) &&
                         (((ENetProtocol *)host->receivedData <= pEVar38 &&
                          (pEVar38 <=
                           (ENetProtocol *)((long)host->receivedData + host->receivedDataLength)))))
                      {
                        peVar28 = (enet_uint16 *)&(command->connect).incomingSessionID;
                        eVar13 = 0;
                        goto LAB_00106bf3;
                      }
                    }
                    goto LAB_00106810;
                  case 8:
                    if (((ulong)(command->header).channelID < peer->channelCount) &&
                       (peer->state - ENET_PEER_STATE_CONNECTED < 2)) {
                      uVar30 = (command->acknowledge).receivedSentTime << 8 |
                               (command->acknowledge).receivedSentTime >> 8;
                      uVar25 = (ulong)uVar30;
                      pEVar38 = (ENetProtocol *)((long)pEVar38 + uVar25);
                      if ((uVar25 <= host->maximumPacketSize) &&
                         (((ENetProtocol *)host->receivedData <= pEVar38 &&
                          (pEVar38 <=
                           (ENetProtocol *)((long)host->receivedData + host->receivedDataLength)))))
                      {
                        uVar24 = (ulong)((uint)(command->header).channelID * 0x50);
                        uVar26 = *peVar28 << 8;
                        uVar11 = uVar26 | *peVar28 >> 8;
                        uVar26 = uVar26 >> 0xc;
                        uVar10 = *(ushort *)((long)peer->channels->reliableWindows + uVar24 + 0x20);
                        uVar32 = uVar26 + 0x10;
                        if (uVar10 <= uVar11) {
                          uVar32 = uVar26;
                        }
                        bVar39 = true;
                        local_b8 = uVar25;
                        if ((uVar32 < uVar10 >> 0xc) || ((ushort)((uVar10 >> 0xc) + 7) <= uVar32))
                        goto LAB_001068a5;
                        uVar15 = (command->sendFragment).fragmentCount;
                        uVar31 = *(uint *)((long)&(command->connect).mtu + 2);
                        uVar31 = uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8
                                 | uVar31 << 0x18;
                        uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8
                                 | uVar15 << 0x18;
                        if (uVar31 < uVar15 && uVar15 < 0x100001) {
                          local_a0 = (ENetChannel *)CONCAT44(local_a0._4_4_,uVar31);
                          uVar31 = *(uint *)((long)&(command->connect).channelCount + 2);
                          uVar36 = uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 |
                                   (uVar31 & 0xff00) << 8 | uVar31 << 0x18;
                          uVar31 = *(uint *)((long)&(command->connect).windowSize + 2);
                          uVar31 = uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 |
                                   (uVar31 & 0xff00) << 8 | uVar31 << 0x18;
                          uVar25 = (ulong)uVar31;
                          local_b8._0_4_ = (uint)uVar30;
                          if ((uint)local_b8 <= uVar31 - uVar36) {
                            if ((uVar36 < uVar31) && (uVar25 <= host->maximumPacketSize)) {
                              pEVar37 = (ENetChannel *)
                                        ((long)peer->channels->reliableWindows + (uVar24 - 6));
                              pEVar21 = (ENetIncomingCommand *)0x0;
                              for (pEVar20 = (ENetIncomingCommand *)
                                             (pEVar37->incomingReliableCommands).sentinel.previous;
                                  pEVar20 !=
                                  (ENetIncomingCommand *)&pEVar37->incomingReliableCommands;
                                  pEVar20 = (ENetIncomingCommand *)
                                            (pEVar20->incomingCommandList).previous) {
                                if (uVar11 < uVar10) {
                                  cVar34 = '\x02';
                                  if (pEVar20->reliableSequenceNumber < uVar10) {
LAB_001066d0:
                                    cVar34 = '\0';
                                    uVar30 = pEVar20->reliableSequenceNumber;
                                    if ((((uVar11 > uVar30 || uVar30 == uVar11) &&
                                         (cVar34 = '\x02', uVar11 <= uVar30)) &&
                                        (cVar34 = '\x01',
                                        ((pEVar20->command).header.command & 0xf) == 8)) &&
                                       (pEVar20->packet->dataLength == uVar25)) {
                                      bVar39 = uVar15 == pEVar20->fragmentCount;
                                      if (bVar39) {
                                        pEVar21 = pEVar20;
                                      }
                                      cVar34 = bVar39 + '\x01';
                                    }
                                  }
                                }
                                else {
                                  cVar34 = '\x04';
                                  if (uVar10 <= pEVar20->reliableSequenceNumber) goto LAB_001066d0;
                                }
                                if ((cVar34 != '\0') && (cVar34 != '\x04')) {
                                  if (cVar34 != '\x02') goto LAB_00106e5c;
                                  break;
                                }
                              }
                              if (pEVar21 == (ENetIncomingCommand *)0x0) {
                                local_68._8_8_ =
                                     *(undefined8 *)&(command->connect).incomingSessionID;
                                local_68._16_8_ =
                                     *(undefined8 *)((long)&(command->connect).windowSize + 2);
                                local_68._24_8_ =
                                     *(undefined8 *)
                                      ((long)&(command->connect).incomingBandwidth + 2);
                                local_68._32_8_ =
                                     *(undefined8 *)
                                      ((long)&(command->connect).packetThrottleInterval + 2);
                                local_68._40_8_ =
                                     *(undefined8 *)
                                      ((long)&(command->connect).packetThrottleDeceleration + 2);
                                local_68.connect.data._2_2_ =
                                     *(undefined2 *)((long)&(command->connect).data + 2);
                                local_68.connect.outgoingPeerID = (command->disconnect).data;
                                local_68._0_2_ = (command->disconnect).header;
                                local_68.header.reliableSequenceNumber = uVar11;
                                pEVar21 = enet_peer_queue_incoming_command
                                                    (peer,&local_68,(void *)0x0,uVar25,1,uVar15);
                                if (pEVar21 == (ENetIncomingCommand *)0x0) goto LAB_00106e5c;
                              }
                              if ((pEVar21->fragments[(uint)local_a0 >> 5] >>
                                   ((uint)local_a0 & 0x1f) & 1) == 0) {
                                pEVar21->fragmentsRemaining = pEVar21->fragmentsRemaining - 1;
                                puVar4 = pEVar21->fragments + ((uint)local_a0 >> 5);
                                *puVar4 = *puVar4 | 1 << ((byte)local_a0 & 0x1f);
                                uVar25 = pEVar21->packet->dataLength;
                                sVar33 = (size_t)((int)uVar25 - uVar36);
                                if ((int)local_b8 + uVar36 <= uVar25) {
                                  sVar33 = local_b8 & 0xffffffff;
                                }
                                memcpy(pEVar21->packet->data + uVar36,
                                       (void *)((long)&(command->connect).incomingBandwidth + 2),
                                       sVar33);
                                if (pEVar21->fragmentsRemaining == 0) {
                                  enet_peer_dispatch_incoming_reliable_commands(peer,pEVar37);
                                }
                              }
                              bVar39 = true;
                            }
                            else {
LAB_00106e5c:
                              bVar39 = false;
                            }
                            goto LAB_001068a5;
                          }
                        }
                        bVar39 = false;
                        goto LAB_001068a5;
                      }
                    }
LAB_001068a3:
                    bVar39 = false;
                    goto LAB_001068a5;
                  case 9:
                    if ((peer->channelCount <= (ulong)(command->header).channelID) ||
                       (1 < peer->state - ENET_PEER_STATE_CONNECTED)) goto LAB_001068a3;
                    uVar25 = (ulong)(ushort)((command->acknowledge).receivedSentTime << 8 |
                                            (command->acknowledge).receivedSentTime >> 8);
                    pEVar38 = (ENetProtocol *)((long)pEVar38 + uVar25);
                    if ((host->maximumPacketSize < uVar25) ||
                       ((pEVar38 < (ENetProtocol *)host->receivedData ||
                        ((ENetProtocol *)((long)host->receivedData + host->receivedDataLength) <
                         pEVar38)))) goto LAB_001068a3;
                    uVar30 = *peVar28;
                    uVar26 = uVar30 << 8 | uVar30 >> 8;
                    uVar10 = peer->incomingUnsequencedGroup;
                    uVar15 = uVar26 + 0x10000;
                    if (uVar10 <= uVar26) {
                      uVar15 = (uint)uVar26;
                    }
                    bVar39 = true;
                    if (uVar15 < uVar10 + 0x8000) {
                      uVar31 = uVar26 & 0x3ff;
                      local_b8 = (ulong)uVar31;
                      uVar15 = (uVar15 & 0xffff) - uVar31;
                      if (uVar15 == uVar10) {
                        if ((peer->unsequencedWindow[uVar31 >> 5] >> (uVar26 & 0x1f) & 1) != 0)
                        goto LAB_001068a5;
                      }
                      else {
                        peer->incomingUnsequencedGroup = (enet_uint16)uVar15;
                        peer->unsequencedWindow[0] = 0;
                        peer->unsequencedWindow[1] = 0;
                        peer->unsequencedWindow[2] = 0;
                        peer->unsequencedWindow[3] = 0;
                        peer->unsequencedWindow[4] = 0;
                        peer->unsequencedWindow[5] = 0;
                        peer->unsequencedWindow[6] = 0;
                        peer->unsequencedWindow[7] = 0;
                        peer->unsequencedWindow[8] = 0;
                        peer->unsequencedWindow[9] = 0;
                        peer->unsequencedWindow[10] = 0;
                        peer->unsequencedWindow[0xb] = 0;
                        peer->unsequencedWindow[0xc] = 0;
                        peer->unsequencedWindow[0xd] = 0;
                        peer->unsequencedWindow[0xe] = 0;
                        peer->unsequencedWindow[0xf] = 0;
                        peer->unsequencedWindow[0x10] = 0;
                        peer->unsequencedWindow[0x11] = 0;
                        peer->unsequencedWindow[0x12] = 0;
                        peer->unsequencedWindow[0x13] = 0;
                        peer->unsequencedWindow[0x14] = 0;
                        peer->unsequencedWindow[0x15] = 0;
                        peer->unsequencedWindow[0x16] = 0;
                        peer->unsequencedWindow[0x17] = 0;
                        peer->unsequencedWindow[0x18] = 0;
                        peer->unsequencedWindow[0x19] = 0;
                        peer->unsequencedWindow[0x1a] = 0;
                        peer->unsequencedWindow[0x1b] = 0;
                        peer->unsequencedWindow[0x1c] = 0;
                        peer->unsequencedWindow[0x1d] = 0;
                        peer->unsequencedWindow[0x1e] = 0;
                        peer->unsequencedWindow[0x1f] = 0;
                      }
                      pEVar20 = enet_peer_queue_incoming_command
                                          (peer,command,&(command->connect).incomingSessionID,uVar25
                                           ,2,0);
                      bVar39 = pEVar20 != (ENetIncomingCommand *)0x0;
                      if (bVar39) {
                        peer->unsequencedWindow[local_b8 >> 5 & 0x7ffffff] =
                             peer->unsequencedWindow[local_b8 >> 5 & 0x7ffffff] |
                             1 << ((byte)(uVar30 >> 8) & 0x1f);
                      }
                    }
LAB_001068a5:
                    iVar12 = 5;
                    pEVar9 = pEVar38;
                    if (bVar39) goto LAB_001068ae;
                    break;
                  case 10:
                    if (peer->state - ENET_PEER_STATE_CONNECTED < 2) {
                      if (peer->incomingBandwidth != 0) {
                        host->bandwidthLimitedPeers = host->bandwidthLimitedPeers - 1;
                      }
                      uVar15 = (command->connect).outgoingPeerID;
                      uVar36 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                               uVar15 << 0x18;
                      peer->incomingBandwidth = uVar36;
                      uVar31 = (command->sendFragment).fragmentCount;
                      peer->outgoingBandwidth =
                           uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8 |
                           uVar31 << 0x18;
                      if (uVar15 == 0) {
                        if (host->outgoingBandwidth != 0) goto LAB_00106967;
                        uVar15 = 0x10000;
                      }
                      else {
                        host->bandwidthLimitedPeers = host->bandwidthLimitedPeers + 1;
                        uVar15 = host->outgoingBandwidth;
                        if (uVar15 == 0) {
LAB_00106967:
                          uVar15 = host->outgoingBandwidth;
                          if (host->outgoingBandwidth < uVar36) {
                            uVar15 = uVar36;
                          }
                        }
                        else if (uVar36 < uVar15) {
                          uVar15 = uVar36;
                        }
                        uVar15 = uVar15 >> 4 & 0xffff000;
                      }
                      peer->windowSize = uVar15;
                      if (uVar15 == 0) {
                        peer->windowSize = 0x1000;
                      }
                      else if (0x10000 < uVar15) {
                        peer->windowSize = 0x10000;
                      }
                      goto LAB_001068ae;
                    }
                    break;
                  case 0xb:
                    if (peer->state - ENET_PEER_STATE_CONNECTED < 2) {
                      uVar15 = (command->connect).outgoingPeerID;
                      peer->packetThrottleInterval =
                           uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                           uVar15 << 0x18;
                      uVar15 = (command->sendFragment).fragmentCount;
                      peer->packetThrottleAcceleration =
                           uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                           uVar15 << 0x18;
                      uVar15 = *(uint *)((long)&(command->connect).mtu + 2);
                      peer->packetThrottleDeceleration =
                           uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                           uVar15 << 0x18;
                      goto LAB_001068ae;
                    }
                    break;
                  case 0xc:
                    if (((ulong)(command->header).channelID < peer->channelCount) &&
                       (peer->state - ENET_PEER_STATE_CONNECTED < 2)) {
                      uVar26 = (command->acknowledge).receivedSentTime << 8 |
                               (command->acknowledge).receivedSentTime >> 8;
                      uVar25 = (ulong)uVar26;
                      pEVar38 = (ENetProtocol *)((long)pEVar38 + uVar25);
                      if ((uVar25 <= host->maximumPacketSize) &&
                         (((ENetProtocol *)host->receivedData <= pEVar38 &&
                          (pEVar38 <=
                           (ENetProtocol *)((long)host->receivedData + host->receivedDataLength)))))
                      {
                        uVar24 = (ulong)((uint)(command->header).channelID * 0x50);
                        uVar30 = uVar30 >> 0xc;
                        uVar32 = *(ushort *)((long)peer->channels->reliableWindows + uVar24 + 0x20);
                        uVar11 = uVar30 + 0x10;
                        if (uVar32 <= uVar10) {
                          uVar11 = uVar30;
                        }
                        local_b8 = uVar25;
                        if ((uVar32 >> 0xc <= uVar11) && (uVar11 < (ushort)((uVar32 >> 0xc) + 7))) {
                          pEVar37 = (ENetChannel *)
                                    ((long)peer->channels->reliableWindows + (uVar24 - 6));
                          uVar30 = *peVar28 << 8 | *peVar28 >> 8;
                          if ((uVar10 != uVar32) ||
                             (pEVar37->incomingUnreliableSequenceNumber < uVar30)) {
                            uVar15 = (command->sendFragment).fragmentCount;
                            uVar31 = *(uint *)((long)&(command->connect).mtu + 2);
                            uVar36 = uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 |
                                     (uVar31 & 0xff00) << 8 | uVar31 << 0x18;
                            uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 |
                                     (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
                            local_a0 = pEVar37;
                            if (uVar36 < uVar15 && uVar15 < 0x100001) {
                              uVar22 = *(uint *)((long)&(command->connect).channelCount + 2);
                              uVar29 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 |
                                       (uVar22 & 0xff00) << 8 | uVar22 << 0x18;
                              uVar22 = *(uint *)((long)&(command->connect).windowSize + 2);
                              uVar22 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 |
                                       (uVar22 & 0xff00) << 8 | uVar22 << 0x18;
                              uVar25 = (ulong)uVar22;
                              local_b8._0_4_ = (uint)uVar26;
                              bVar39 = (uint)local_b8 <= uVar22 - uVar29;
                              if (((bVar39) && (uVar29 < uVar22)) &&
                                 (uVar25 <= host->maximumPacketSize)) {
                                pEVar20 = (ENetIncomingCommand *)
                                          (pEVar37->incomingUnreliableCommands).sentinel.previous;
                                if (pEVar20 ==
                                    (ENetIncomingCommand *)&pEVar37->incomingUnreliableCommands) {
                                  local_c8 = (ENetIncomingCommand *)0x0;
                                }
                                else {
                                  local_c8 = (ENetIncomingCommand *)0x0;
                                  do {
                                    if (uVar10 < uVar32) {
                                      cVar34 = '\x02';
                                      if (pEVar20->reliableSequenceNumber < uVar32) {
LAB_001062d4:
                                        cVar34 = '\x02';
                                        if (uVar10 <= pEVar20->reliableSequenceNumber) {
                                          if (uVar10 < pEVar20->reliableSequenceNumber) {
                                            cVar34 = '\x04';
                                          }
                                          else if (uVar30 < pEVar20->unreliableSequenceNumber) {
                                            cVar34 = '\0';
                                          }
                                          else if (((uVar30 <= pEVar20->unreliableSequenceNumber) &&
                                                   (cVar34 = '\x01',
                                                   ((pEVar20->command).header.command & 0xf) == 0xc)
                                                   ) && (pEVar20->packet->dataLength == uVar25)) {
                                            bVar39 = uVar15 == pEVar20->fragmentCount;
                                            if (bVar39) {
                                              local_c8 = pEVar20;
                                            }
                                            cVar34 = bVar39 + '\x01';
                                          }
                                        }
                                      }
                                    }
                                    else {
                                      cVar34 = '\x04';
                                      if (uVar32 <= pEVar20->reliableSequenceNumber)
                                      goto LAB_001062d4;
                                    }
                                    if ((cVar34 != '\0') && (cVar34 != '\x04')) {
                                      if (cVar34 != '\x02') goto LAB_00106f49;
                                      break;
                                    }
                                    pEVar20 = (ENetIncomingCommand *)
                                              (pEVar20->incomingCommandList).previous;
                                  } while (pEVar20 !=
                                           (ENetIncomingCommand *)
                                           &pEVar37->incomingUnreliableCommands);
                                }
                                if ((local_c8 != (ENetIncomingCommand *)0x0) ||
                                   (local_c8 = enet_peer_queue_incoming_command
                                                         (peer,command,(void *)0x0,uVar25,8,uVar15),
                                   local_c8 != (ENetIncomingCommand *)0x0)) {
                                  uVar36 = uVar36 >> 5;
                                  if ((local_c8->fragments[uVar36] >> (uVar31 >> 0x18 & 0x1f) & 1)
                                      == 0) {
                                    local_c8->fragmentsRemaining = local_c8->fragmentsRemaining - 1;
                                    puVar4 = local_c8->fragments + uVar36;
                                    *puVar4 = *puVar4 | 1 << ((byte)(uVar31 >> 0x18) & 0x1f);
                                    uVar25 = local_c8->packet->dataLength;
                                    sVar33 = (size_t)((int)uVar25 - uVar29);
                                    if ((int)local_b8 + uVar29 <= uVar25) {
                                      sVar33 = local_b8 & 0xffffffff;
                                    }
                                    memcpy(local_c8->packet->data + uVar29,
                                           (void *)((long)&(command->connect).incomingBandwidth + 2)
                                           ,sVar33);
                                    if (local_c8->fragmentsRemaining == 0) {
                                      enet_peer_dispatch_incoming_unreliable_commands(peer,local_a0)
                                      ;
                                    }
                                  }
                                  goto LAB_00106f32;
                                }
                              }
                            }
LAB_00106f49:
                            bVar39 = false;
                            goto LAB_00106812;
                          }
                        }
LAB_00106f32:
                        bVar39 = true;
                        goto LAB_00106812;
                      }
                    }
LAB_00106810:
                    bVar39 = false;
LAB_00106812:
                    iVar12 = 5;
                    pEVar9 = pEVar38;
                    if (bVar39) goto LAB_001068ae;
                  }
switchD_001060fa_default:
                  command = pEVar9;
                  bVar39 = true;
                  event = local_b0;
                } while (iVar12 == 0);
                if ((iVar12 == 5) || (iVar12 == 3)) {
LAB_00106faf:
                  bVar39 = true;
                  if ((event != (ENetEvent *)0x0) && (event->type != ENET_EVENT_TYPE_NONE)) {
                    bVar39 = false;
                  }
                }
              }
              else {
                pvVar6 = (host->compressor).context;
                if ((pvVar6 != (void *)0x0) &&
                   (p_Var7 = (host->compressor).decompress,
                   p_Var7 != (_func_size_t_void_ptr_enet_uint8_ptr_size_t_enet_uint8_ptr_size_t *)
                             0x0)) {
                  sVar18 = (*p_Var7)(pvVar6,(enet_uint8 *)((long)puVar4 + sVar33),
                                     host->receivedDataLength - sVar33,*local_90 + sVar33,
                                     0x1000 - sVar33);
                  paeVar8 = local_90;
                  if (sVar18 - 1 < 0x1000 - sVar33) {
                    memcpy(local_90,local_98,sVar33);
                    host->receivedData = *paeVar8;
                    host->receivedDataLength = sVar18 + sVar33;
                    event = local_b0;
                    goto LAB_00105eba;
                  }
                  bVar39 = true;
                  event = local_b0;
                }
              }
            }
            else if ((ulong)uVar15 < host->peerCount) {
              peer = host->peer_list[uVar15];
              if ((peer->state != ENET_PEER_STATE_DISCONNECTED) &&
                 (peer->state != ENET_PEER_STATE_ZOMBIE)) {
                eVar13 = (peer->address).host;
                if (local_88->host == eVar13) {
                  if ((eVar13 == 0xffffffff) ||
                     ((host->receivedAddress).port == (peer->address).port)) {
LAB_00106fe0:
                    if ((0xfffffe < peer->outgoingPeerID) ||
                       ((uVar27 & 0x3000000) >> 0x18 == (uint)peer->incomingSessionID))
                    goto LAB_00105e97;
                  }
                }
                else if (eVar13 == 0xffffffff) goto LAB_00106fe0;
              }
            }
          }
LAB_00105e31:
          iVar16 = iVar14;
          if (!bVar39) {
            iVar16 = 1;
          }
          bVar39 = (bool)(bVar39 ^ 1);
        }
        else {
          iVar16 = (*host->intercept)(host,event);
          if (iVar16 != -1) {
            if (iVar16 != 1) goto LAB_00105e21;
            if (event != (_ENetEvent *)0x0) {
              bVar39 = true;
              iVar16 = 1;
              if (event->type != ENET_EVENT_TYPE_NONE) goto LAB_00105e47;
            }
            bVar39 = false;
            iVar16 = iVar14;
          }
        }
      }
LAB_00105e47:
      iVar12 = local_a4;
      if (bVar39) goto LAB_0010700f;
      iVar35 = iVar35 + 1;
      iVar14 = iVar16;
    } while (iVar35 != 0x100);
    iVar16 = -1;
LAB_0010700f:
    if (iVar16 == -1) {
      return -1;
    }
    if (iVar16 == 1) {
      return 1;
    }
    iVar14 = enet_protocol_send_outgoing_commands(host,event,1);
    if (iVar14 == -1) {
      return -1;
    }
    if (iVar14 == 1) {
      return 1;
    }
    if (event != (ENetEvent *)0x0) {
      iVar14 = enet_protocol_dispatch_incoming_commands(host,event);
      if (iVar14 == -1) {
        return -1;
      }
      if (iVar14 == 1) {
        return 1;
      }
    }
    if (host->serviceTime - iVar12 < 86400000) {
      return 0;
    }
    do {
      eVar13 = enet_time_get();
      host->serviceTime = eVar13;
      if (eVar13 - iVar12 < 86400000) {
        return 0;
      }
      local_bc = 6;
      eVar23 = iVar12 - eVar13;
      if (86399999 < iVar12 - eVar13) {
        eVar23 = eVar13 - iVar12;
      }
      iVar14 = enet_socket_wait(host->socket,&local_bc,eVar23);
      if (iVar14 != 0) {
        return -1;
      }
    } while ((local_bc & 4) != 0);
    eVar13 = enet_time_get();
    host->serviceTime = eVar13;
    if ((local_bc & 2) == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

int
enet_host_service (ENetHost * host, ENetEvent * event, enet_uint32 timeout)
{
    enet_uint32 waitCondition;

    if (event != NULL)
    {
        event -> type = ENET_EVENT_TYPE_NONE;
        event -> peer = NULL;
        event -> packet = NULL;

        switch (enet_protocol_dispatch_incoming_commands (host, event))
        {
        case 1:
            return 1;

        case -1:
#ifdef ENET_DEBUG
            perror ("Error dispatching incoming packets");
#endif

            return -1;

        default:
            break;
        }
    }

    host -> serviceTime = enet_time_get ();
    
    timeout += host -> serviceTime;

    do
    {
       if (ENET_TIME_DIFFERENCE (host -> serviceTime, host -> bandwidthThrottleEpoch) >= ENET_HOST_BANDWIDTH_THROTTLE_INTERVAL)
         enet_host_bandwidth_throttle (host);

       switch (enet_protocol_send_outgoing_commands (host, event, 1))
       {
       case 1:
          return 1;

       case -1:
#ifdef ENET_DEBUG
          perror ("Error sending outgoing packets");
#endif

          return -1;

       default:
          break;
       }

       switch (enet_protocol_receive_incoming_commands (host, event))
       {
       case 1:
          return 1;

       case -1:
#ifdef ENET_DEBUG
          perror ("Error receiving incoming packets");
#endif

          return -1;

       default:
          break;
       }

       switch (enet_protocol_send_outgoing_commands (host, event, 1))
       {
       case 1:
          return 1;

       case -1:
#ifdef ENET_DEBUG
          perror ("Error sending outgoing packets");
#endif

          return -1;

       default:
          break;
       }

       if (event != NULL)
       {
          switch (enet_protocol_dispatch_incoming_commands (host, event))
          {
          case 1:
             return 1;

          case -1:
#ifdef ENET_DEBUG
             perror ("Error dispatching incoming packets");
#endif

             return -1;

          default:
             break;
          }
       }

       if (ENET_TIME_GREATER_EQUAL (host -> serviceTime, timeout))
         return 0;

       do
       {
          host -> serviceTime = enet_time_get ();

          if (ENET_TIME_GREATER_EQUAL (host -> serviceTime, timeout))
            return 0;

          waitCondition = ENET_SOCKET_WAIT_RECEIVE | ENET_SOCKET_WAIT_INTERRUPT;

          if (enet_socket_wait (host -> socket, & waitCondition, ENET_TIME_DIFFERENCE (timeout, host -> serviceTime)) != 0)
            return -1;
       }
       while (waitCondition & ENET_SOCKET_WAIT_INTERRUPT);

       host -> serviceTime = enet_time_get ();
    } while (waitCondition & ENET_SOCKET_WAIT_RECEIVE);

    return 0; 
}